

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_DetachItemFromObject(cJSON *object,char *string)

{
  int iVar1;
  cJSON *pcVar2;
  int which;
  
  pcVar2 = (cJSON *)&object->child;
  which = 0;
  while( true ) {
    pcVar2 = pcVar2->next;
    if (pcVar2 == (cJSON *)0x0) {
      return (cJSON *)0x0;
    }
    iVar1 = cJSON_strcasecmp(pcVar2->string,string);
    if (iVar1 == 0) break;
    which = which + 1;
  }
  pcVar2 = cJSON_DetachItemFromArray(object,which);
  return pcVar2;
}

Assistant:

cJSON *
cJSON_DetachItemFromObject(cJSON *object, const char *string)
{
    int i = 0;
    cJSON *c = object->child;
    while (c && cJSON_strcasecmp(c->string, string))
        i++, c = c->next;
    if (c)
        return cJSON_DetachItemFromArray(object, i);
    return 0;
}